

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Nullability __thiscall wasm::TranslateToFuzzReader::getNullability(TranslateToFuzzReader *this)

{
  bool bVar1;
  
  if ((((byte)this->wasm[0x179] & 4) != 0) && (bVar1 = Random::oneIn(&this->random,2), bVar1)) {
    return NonNullable;
  }
  return Nullable;
}

Assistant:

Nullability TranslateToFuzzReader::getNullability() {
  // Without wasm GC, avoid non-nullable types as we cannot create any values
  // of such types. For example, reference types adds eqref, but there is no
  // way to create such a value, only to receive it from the outside, while GC
  // adds i31/struct/array creation. Without GC, we will likely need to create a
  // null of this type (unless we are lucky enough to have a non-null value
  // arriving from an import), so avoid a non-null type if possible.
  if (wasm.features.hasGC() && oneIn(2)) {
    return NonNullable;
  }
  return Nullable;
}